

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

uint mcpl_generic_fread_try(mcpl_generic_filehandle_t *fh,char *dest,uint nbytes)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint in_EDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t rv_1;
  int rv;
  uint nb_totry;
  uint nb_read;
  uint nb_left;
  uint local_3c;
  uint local_28;
  uint local_24;
  void *local_18;
  
  if (0x7fffffff < in_EDX) {
    mcpl_error((char *)0x10a718);
  }
  local_28 = 0;
  local_24 = in_EDX;
  local_18 = in_RSI;
  do {
    if (local_24 == 0) {
      return local_28;
    }
    if (local_24 < 0x8001) {
      local_3c = local_24;
    }
    else {
      local_3c = 0x8000;
    }
    if (*(int *)(in_RDI + 2) == 0) {
      sVar3 = fread(local_18,1,(ulong)local_3c,(FILE *)*in_RDI);
      iVar1 = (int)sVar3;
      if (sVar3 != local_3c) {
        iVar2 = feof((FILE *)*in_RDI);
        if (iVar2 != 0) {
          if (sVar3 != 0) {
            local_28 = iVar1 + local_28;
            in_RDI[1] = sVar3 + in_RDI[1];
          }
          return local_28;
        }
        mcpl_error((char *)0x10a878);
      }
      local_28 = iVar1 + local_28;
      in_RDI[1] = sVar3 + in_RDI[1];
    }
    else {
      iVar1 = gzread(*in_RDI,local_18,local_3c);
      if (iVar1 < 0) {
        mcpl_error((char *)0x10a79f);
      }
      if (iVar1 < 1) {
        return local_28;
      }
      local_28 = iVar1 + local_28;
      in_RDI[1] = (ulong)local_28 + in_RDI[1];
      sVar3 = (size_t)iVar1;
    }
    local_18 = (void *)((long)local_18 + sVar3);
    local_24 = local_24 - iVar1;
  } while( true );
}

Assistant:

unsigned mcpl_generic_fread_try( mcpl_generic_filehandle_t* fh,
                                 char * dest, unsigned nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(unsigned) >= sizeof(int32_t) );
  MCPL_STATIC_ASSERT( sizeof(z_off_t) >= sizeof(int32_t) );

  if ( nbytes > INT32_MAX )
    mcpl_error("too large nbytes value for mcpl_generic_fread_try");

  unsigned nb_left = nbytes;
  unsigned nb_read = 0;

  while (1) {
    if ( !nb_left )
      return nb_read;
    unsigned nb_totry = ( nb_left > 32768 ? 32768 : nb_left );
    if ( fh->mode ) {
      int rv = gzread((gzFile)(fh->internal), dest, (z_off_t)nb_totry);
      if ( rv < 0 )
        mcpl_error("Error while reading from file");
      if ( rv < 1 )
        return nb_read;
      nb_read += (unsigned)rv;
      fh->current_pos += nb_read;
      dest += rv;
      nb_left -= (unsigned)rv;
    } else {
      size_t rv = fread(dest, 1, (size_t)nb_totry, (FILE*)(fh->internal));
      if ( rv != (size_t)nb_totry ) {
        if ( feof((FILE*)(fh->internal)) ) {
          //not an error, simply reached the end of the file.
          if ( rv ) {
            nb_read += (unsigned)rv;
            fh->current_pos += rv;
          }
          return nb_read;
        }
        mcpl_error("Error while reading from file");
      }
      dest += rv;
      nb_read += (unsigned)rv;
      fh->current_pos += rv;
      nb_left -= (unsigned)rv;
    }

  }
}